

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetGXToolInfo(ndicapi *pol,int port)

{
  char cVar1;
  uint uVar2;
  char (*pacVar3) [12];
  int i;
  long lVar4;
  int iVar5;
  
  if (port - 0x31U < 3) {
    pacVar3 = pol->GxInformation + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 0;
    }
    pacVar3 = pol->GxPassiveInformation + (port - 0x41U);
  }
  lVar4 = 0;
  uVar2 = 0;
  while( true ) {
    cVar1 = (*pacVar3)[lVar4];
    iVar5 = -0x57;
    if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
    uVar2 = uVar2 << 4 | iVar5 + cVar1;
    lVar4 = lVar4 + 1;
    if (lVar4 == 2) {
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

ndicapiExport int ndiGetGXToolInfo(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxInformation[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->GxPassiveInformation[port - 'A'];
  }
  else
  {
    return 0;
  }

  return (int)ndiHexToUnsignedLong(dp, 2);
}